

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void print_resources(Compiler *compiler,char *tag,SmallVector<spirv_cross::Resource,_8UL> *resources
                    )

{
  FILE *pFVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  TypedID<(spirv_cross::Types)2> TVar5;
  StorageClass SVar6;
  StorageClass SVar7;
  uint32_t uVar8;
  Resource *pRVar9;
  SPIRType *pSVar10;
  Bitset *pBVar11;
  SPIRType *type_00;
  size_t sVar12;
  size_t sVar13;
  ulong uVar14;
  undefined8 uVar15;
  bool bVar16;
  bool local_2ee;
  undefined8 local_290;
  bool local_229;
  bool local_21d;
  uint32_t local_218;
  uint32_t local_214;
  uint32_t counter_id;
  uint32_t local_20c;
  uint32_t local_208;
  uint32_t local_204;
  byte local_1fd;
  uint32_t local_1fc;
  string local_1f8 [38];
  byte local_1d2;
  allocator local_1d1;
  spirv_cross local_1d0 [32];
  spirv_cross local_1b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190 [36];
  uint local_16c;
  uint *puStack_168;
  uint arr;
  uint *__end2;
  uint *__begin2;
  SmallVector<unsigned_int,_8UL> *__range2;
  string array;
  Bitset local_118;
  undefined1 local_d8 [8];
  Bitset mask;
  SPIRType *base_type;
  uint local_80;
  uint32_t runtime_array_stride;
  uint32_t block_size;
  ID fallback_id;
  bool is_sized_block;
  bool is_block;
  bool is_push_constant;
  SPIRType *type;
  Resource *res;
  Resource *__end1;
  Resource *__begin1;
  SmallVector<spirv_cross::Resource,_8UL> *__range1;
  bool print_ssbo;
  SmallVector<spirv_cross::Resource,_8UL> *resources_local;
  char *tag_local;
  Compiler *compiler_local;
  
  fprintf(_stderr,"%s\n",tag);
  fprintf(_stderr,"=============\n\n");
  iVar4 = strcmp(tag,"ssbos");
  bVar16 = iVar4 == 0;
  __end1 = spirv_cross::VectorView<spirv_cross::Resource>::begin
                     (&resources->super_VectorView<spirv_cross::Resource>);
  pRVar9 = spirv_cross::VectorView<spirv_cross::Resource>::end
                     (&resources->super_VectorView<spirv_cross::Resource>);
  for (; __end1 != pRVar9; __end1 = __end1 + 1) {
    pSVar10 = spirv_cross::Compiler::get_type(compiler,(TypeID)(__end1->type_id).id);
    local_21d = false;
    if (bVar16) {
      TVar5 = spirv_cross::TypedID::operator_cast_to_TypedID((TypedID *)__end1);
      local_21d = spirv_cross::Compiler::buffer_is_hlsl_counter_buffer
                            (compiler,(VariableID)TVar5.id);
    }
    if (local_21d == false) {
      TVar5 = spirv_cross::TypedID::operator_cast_to_TypedID((TypedID *)__end1);
      SVar6 = spirv_cross::Compiler::get_storage_class(compiler,(VariableID)TVar5.id);
      pBVar11 = spirv_cross::Compiler::get_decoration_bitset
                          (compiler,(ID)(pSVar10->super_IVariant).self.id);
      bVar2 = spirv_cross::Bitset::get(pBVar11,2);
      local_229 = true;
      if (!bVar2) {
        pBVar11 = spirv_cross::Compiler::get_decoration_bitset
                            (compiler,(ID)(pSVar10->super_IVariant).self.id);
        local_229 = spirv_cross::Bitset::get(pBVar11,3);
      }
      bVar2 = false;
      if (local_229 != false) {
        fallback_id.id = (uint32_t)spirv_cross::TypedID::operator_cast_to_TypedID((TypedID *)__end1)
        ;
        SVar7 = spirv_cross::Compiler::get_storage_class(compiler,(VariableID)fallback_id.id);
        bVar2 = true;
        if (SVar7 != StorageClassUniform) {
          block_size = (uint32_t)spirv_cross::TypedID::operator_cast_to_TypedID((TypedID *)__end1);
          SVar7 = spirv_cross::Compiler::get_storage_class(compiler,(VariableID)block_size);
          bVar2 = SVar7 == StorageClassUniformConstant;
        }
      }
      if ((SVar6 == StorageClassPushConstant) || (local_229 == false)) {
        runtime_array_stride = (__end1->id).id;
      }
      else {
        spirv_cross::TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)1>
                  ((TypedID<(spirv_cross::Types)0> *)&runtime_array_stride,&__end1->base_type_id);
      }
      local_80 = 0;
      base_type._4_4_ = 0;
      if (bVar2) {
        mask.higher._M_h._M_single_bucket._4_4_ = (__end1->base_type_id).id;
        type_00 = spirv_cross::Compiler::get_type(compiler,mask.higher._M_h._M_single_bucket._4_4_);
        sVar12 = spirv_cross::Compiler::get_declared_struct_size(compiler,type_00);
        local_80 = (uint)sVar12;
        sVar12 = spirv_cross::Compiler::get_declared_struct_size_runtime_array(compiler,type_00,1);
        sVar13 = spirv_cross::Compiler::get_declared_struct_size_runtime_array(compiler,type_00,0);
        base_type._4_4_ = (int)sVar12 - (int)sVar13;
      }
      spirv_cross::Bitset::Bitset((Bitset *)local_d8);
      if (bVar16) {
        TVar5 = spirv_cross::TypedID::operator_cast_to_TypedID((TypedID *)__end1);
        spirv_cross::Compiler::get_buffer_block_flags(&local_118,compiler,(VariableID)TVar5.id);
        spirv_cross::Bitset::operator=((Bitset *)local_d8,&local_118);
        spirv_cross::Bitset::~Bitset(&local_118);
      }
      else {
        pBVar11 = spirv_cross::Compiler::get_decoration_bitset(compiler,(ID)(__end1->id).id);
        spirv_cross::Bitset::operator=((Bitset *)local_d8,pBVar11);
      }
      std::__cxx11::string::string((string *)&__range2);
      __begin2 = (uint *)&pSVar10->array;
      __end2 = spirv_cross::VectorView<unsigned_int>::begin((VectorView<unsigned_int> *)__begin2);
      puStack_168 = spirv_cross::VectorView<unsigned_int>::end((VectorView<unsigned_int> *)__begin2)
      ;
      for (; pFVar1 = _stderr, __end2 != puStack_168; __end2 = __end2 + 1) {
        local_16c = *__end2;
        local_1d2 = 0;
        if (local_16c == 0) {
          std::allocator<char>::allocator();
          local_1d2 = 1;
          std::__cxx11::string::string((string *)local_1d0,"",&local_1d1);
        }
        else {
          spirv_cross::convert_to_string<unsigned_int,_0>(local_1d0,&local_16c);
        }
        spirv_cross::join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (local_1b0,(char (*) [2])0x5b2ad8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                   (char (*) [2])0x5ab046);
        std::operator+(local_190,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b0);
        std::__cxx11::string::operator=((string *)&__range2,(string *)local_190);
        std::__cxx11::string::~string((string *)local_190);
        std::__cxx11::string::~string((string *)local_1b0);
        std::__cxx11::string::~string((string *)local_1d0);
        if ((local_1d2 & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
        }
      }
      uVar8 = spirv_cross::TypedID::operator_cast_to_unsigned_int((TypedID *)__end1);
      uVar14 = std::__cxx11::string::empty();
      local_1fd = 0;
      if ((uVar14 & 1) == 0) {
        local_290 = std::__cxx11::string::c_str();
      }
      else {
        local_1fc = runtime_array_stride;
        (*compiler->_vptr_Compiler[3])(local_1f8,compiler,(ulong)runtime_array_stride);
        local_1fd = 1;
        local_290 = std::__cxx11::string::c_str();
      }
      uVar15 = std::__cxx11::string::c_str();
      fprintf(pFVar1," ID %03u : %s%s",(ulong)uVar8,local_290,uVar15);
      if ((local_1fd & 1) != 0) {
        std::__cxx11::string::~string(local_1f8);
      }
      bVar3 = spirv_cross::Bitset::get((Bitset *)local_d8,0x1e);
      pFVar1 = _stderr;
      if (bVar3) {
        local_204 = (__end1->id).id;
        uVar8 = spirv_cross::Compiler::get_decoration(compiler,(ID)local_204,DecorationLocation);
        fprintf(pFVar1," (Location : %u)",(ulong)uVar8);
      }
      bVar3 = spirv_cross::Bitset::get((Bitset *)local_d8,0x22);
      pFVar1 = _stderr;
      if (bVar3) {
        local_208 = (__end1->id).id;
        uVar8 = spirv_cross::Compiler::get_decoration
                          (compiler,(ID)local_208,DecorationDescriptorSet);
        fprintf(pFVar1," (Set : %u)",(ulong)uVar8);
      }
      bVar3 = spirv_cross::Bitset::get((Bitset *)local_d8,0x21);
      pFVar1 = _stderr;
      if (bVar3) {
        local_20c = (__end1->id).id;
        uVar8 = spirv_cross::Compiler::get_decoration(compiler,(ID)local_20c,DecorationBinding);
        fprintf(pFVar1," (Binding : %u)",(ulong)uVar8);
      }
      counter_id = (uint32_t)spirv_cross::TypedID::operator_cast_to_TypedID((TypedID *)__end1);
      bVar3 = spirv_cross::CompilerGLSL::variable_is_depth_or_compare
                        ((CompilerGLSL *)compiler,(VariableID)counter_id);
      if (bVar3) {
        fprintf(_stderr," (comparison)");
      }
      bVar3 = spirv_cross::Bitset::get((Bitset *)local_d8,0x2b);
      pFVar1 = _stderr;
      if (bVar3) {
        local_214 = (__end1->id).id;
        uVar8 = spirv_cross::Compiler::get_decoration
                          (compiler,(ID)local_214,DecorationInputAttachmentIndex);
        fprintf(pFVar1," (Attachment : %u)",(ulong)uVar8);
      }
      bVar3 = spirv_cross::Bitset::get((Bitset *)local_d8,0x19);
      if (bVar3) {
        fprintf(_stderr," writeonly");
      }
      bVar3 = spirv_cross::Bitset::get((Bitset *)local_d8,0x18);
      if (bVar3) {
        fprintf(_stderr," readonly");
      }
      bVar3 = spirv_cross::Bitset::get((Bitset *)local_d8,0x13);
      if (bVar3) {
        fprintf(_stderr," restrict");
      }
      bVar3 = spirv_cross::Bitset::get((Bitset *)local_d8,0x17);
      if (bVar3) {
        fprintf(_stderr," coherent");
      }
      bVar3 = spirv_cross::Bitset::get((Bitset *)local_d8,0x15);
      if (bVar3) {
        fprintf(_stderr," volatile");
      }
      if ((bVar2) &&
         (fprintf(_stderr," (BlockSize : %u bytes)",(ulong)local_80), base_type._4_4_ != 0)) {
        fprintf(_stderr," (Unsized array stride: %u bytes)",(ulong)base_type._4_4_);
      }
      local_218 = 0;
      local_2ee = false;
      if (bVar16) {
        TVar5 = spirv_cross::TypedID::operator_cast_to_TypedID((TypedID *)__end1);
        local_2ee = spirv_cross::Compiler::buffer_get_hlsl_counter_buffer
                              (compiler,(VariableID)TVar5.id,&local_218);
      }
      if (local_2ee != false) {
        fprintf(_stderr," (HLSL counter buffer ID: %u)",(ulong)local_218);
      }
      fprintf(_stderr,"\n");
      std::__cxx11::string::~string((string *)&__range2);
      spirv_cross::Bitset::~Bitset((Bitset *)local_d8);
    }
  }
  fprintf(_stderr,"=============\n\n");
  return;
}

Assistant:

static void print_resources(const Compiler &compiler, const char *tag, const SmallVector<Resource> &resources)
{
	fprintf(stderr, "%s\n", tag);
	fprintf(stderr, "=============\n\n");
	bool print_ssbo = !strcmp(tag, "ssbos");

	for (auto &res : resources)
	{
		auto &type = compiler.get_type(res.type_id);

		if (print_ssbo && compiler.buffer_is_hlsl_counter_buffer(res.id))
			continue;

		// If we don't have a name, use the fallback for the type instead of the variable
		// for SSBOs and UBOs since those are the only meaningful names to use externally.
		// Push constant blocks are still accessed by name and not block name, even though they are technically Blocks.
		bool is_push_constant = compiler.get_storage_class(res.id) == StorageClassPushConstant;
		bool is_block = compiler.get_decoration_bitset(type.self).get(DecorationBlock) ||
		                compiler.get_decoration_bitset(type.self).get(DecorationBufferBlock);
		bool is_sized_block = is_block && (compiler.get_storage_class(res.id) == StorageClassUniform ||
		                                   compiler.get_storage_class(res.id) == StorageClassUniformConstant);
		ID fallback_id = !is_push_constant && is_block ? ID(res.base_type_id) : ID(res.id);

		uint32_t block_size = 0;
		uint32_t runtime_array_stride = 0;
		if (is_sized_block)
		{
			auto &base_type = compiler.get_type(res.base_type_id);
			block_size = uint32_t(compiler.get_declared_struct_size(base_type));
			runtime_array_stride = uint32_t(compiler.get_declared_struct_size_runtime_array(base_type, 1) -
			                                compiler.get_declared_struct_size_runtime_array(base_type, 0));
		}

		Bitset mask;
		if (print_ssbo)
			mask = compiler.get_buffer_block_flags(res.id);
		else
			mask = compiler.get_decoration_bitset(res.id);

		string array;
		for (auto arr : type.array)
			array = join("[", arr ? convert_to_string(arr) : "", "]") + array;

		fprintf(stderr, " ID %03u : %s%s", uint32_t(res.id),
		        !res.name.empty() ? res.name.c_str() : compiler.get_fallback_name(fallback_id).c_str(), array.c_str());

		if (mask.get(DecorationLocation))
			fprintf(stderr, " (Location : %u)", compiler.get_decoration(res.id, DecorationLocation));
		if (mask.get(DecorationDescriptorSet))
			fprintf(stderr, " (Set : %u)", compiler.get_decoration(res.id, DecorationDescriptorSet));
		if (mask.get(DecorationBinding))
			fprintf(stderr, " (Binding : %u)", compiler.get_decoration(res.id, DecorationBinding));
		if (static_cast<const CompilerGLSL &>(compiler).variable_is_depth_or_compare(res.id))
			fprintf(stderr, " (comparison)");
		if (mask.get(DecorationInputAttachmentIndex))
			fprintf(stderr, " (Attachment : %u)", compiler.get_decoration(res.id, DecorationInputAttachmentIndex));
		if (mask.get(DecorationNonReadable))
			fprintf(stderr, " writeonly");
		if (mask.get(DecorationNonWritable))
			fprintf(stderr, " readonly");
		if (mask.get(DecorationRestrict))
			fprintf(stderr, " restrict");
		if (mask.get(DecorationCoherent))
			fprintf(stderr, " coherent");
		if (mask.get(DecorationVolatile))
			fprintf(stderr, " volatile");
		if (is_sized_block)
		{
			fprintf(stderr, " (BlockSize : %u bytes)", block_size);
			if (runtime_array_stride)
				fprintf(stderr, " (Unsized array stride: %u bytes)", runtime_array_stride);
		}

		uint32_t counter_id = 0;
		if (print_ssbo && compiler.buffer_get_hlsl_counter_buffer(res.id, counter_id))
			fprintf(stderr, " (HLSL counter buffer ID: %u)", counter_id);
		fprintf(stderr, "\n");
	}
	fprintf(stderr, "=============\n\n");
}